

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbkeyboard.cpp
# Opt level: O2

void __thiscall QXcbKeyboard::updateKeymap(QXcbKeyboard *this)

{
  ScopedXKBContext *this_00;
  xkb_context *pxVar1;
  QXcbConnection *pQVar2;
  undefined8 uVar3;
  pointer __p;
  QLoggingCategory *pQVar4;
  pointer __p_00;
  pointer __p_01;
  xkb_keymap *pxVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  undefined1 local_48 [32];
  KeysymModifierMap local_28;
  xcb_key_symbols_t *local_20;
  
  local_20 = *(xcb_key_symbols_t **)(in_FS_OFFSET + 0x28);
  local_28.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_*>
          )0x0;
  if ((((this->super_QXcbObject).m_connection)->super_QXcbBasicConnection).m_hasXkb == false) {
    keysymsToModifiers((QXcbKeyboard *)local_48);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_>
    ::operator=(&local_28.d,
                (QExplicitlySharedDataPointerV2<QMapData<std::map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_>
                 *)local_48);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_>
                *)local_48);
  }
  updateModifiers(this,&local_28);
  this->m_config = true;
  if ((this->m_xkbContext)._M_t.super___uniq_ptr_impl<xkb_context,_QXkbCommon::XKBContextDeleter>.
      _M_t.super__Tuple_impl<0UL,_xkb_context_*,_QXkbCommon::XKBContextDeleter>.
      super__Head_base<0UL,_xkb_context_*,_false>._M_head_impl == (xkb_context *)0x0) {
    this_00 = &this->m_xkbContext;
    __p = (pointer)xkb_context_new(1);
    std::__uniq_ptr_impl<xkb_context,_QXkbCommon::XKBContextDeleter>::reset
              ((__uniq_ptr_impl<xkb_context,_QXkbCommon::XKBContextDeleter> *)this_00,__p);
    pxVar1 = (this_00->_M_t).super___uniq_ptr_impl<xkb_context,_QXkbCommon::XKBContextDeleter>._M_t.
             super__Tuple_impl<0UL,_xkb_context_*,_QXkbCommon::XKBContextDeleter>.
             super__Head_base<0UL,_xkb_context_*,_false>._M_head_impl;
    pQVar4 = QtPrivateLogging::lcQpaKeyboard();
    if (pxVar1 != (xkb_context *)0x0) {
      uVar3 = 10;
      if (((pQVar4->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
        uVar3 = 0x32;
      }
      xkb_context_set_log_level
                ((this_00->_M_t).super___uniq_ptr_impl<xkb_context,_QXkbCommon::XKBContextDeleter>.
                 _M_t.super__Tuple_impl<0UL,_xkb_context_*,_QXkbCommon::XKBContextDeleter>.
                 super__Head_base<0UL,_xkb_context_*,_false>._M_head_impl,uVar3);
      goto LAB_0015b41c;
    }
    if (((pQVar4->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      local_48._24_8_ = pQVar4->name;
      pcVar6 = "failed to create XKB context";
      goto LAB_0015b555;
    }
  }
  else {
LAB_0015b41c:
    pQVar2 = (this->super_QXcbObject).m_connection;
    if ((pQVar2->super_QXcbBasicConnection).m_hasXkb == true) {
      __p_00 = (pointer)xkb_x11_keymap_new_from_device
                                  ((this->m_xkbContext)._M_t.
                                   super___uniq_ptr_impl<xkb_context,_QXkbCommon::XKBContextDeleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_xkb_context_*,_QXkbCommon::XKBContextDeleter>
                                   .super__Head_base<0UL,_xkb_context_*,_false>._M_head_impl,
                                   (pQVar2->super_QXcbBasicConnection).m_xcbConnection,
                                   this->core_device_id,0);
      std::__uniq_ptr_impl<xkb_keymap,_QXkbCommon::XKBKeymapDeleter>::reset
                ((__uniq_ptr_impl<xkb_keymap,_QXkbCommon::XKBKeymapDeleter> *)&this->m_xkbKeymap,
                 __p_00);
      pxVar5 = (this->m_xkbKeymap)._M_t.
               super___uniq_ptr_impl<xkb_keymap,_QXkbCommon::XKBKeymapDeleter>._M_t.
               super__Tuple_impl<0UL,_xkb_keymap_*,_QXkbCommon::XKBKeymapDeleter>.
               super__Head_base<0UL,_xkb_keymap_*,_false>._M_head_impl;
      if (pxVar5 != (xkb_keymap *)0x0) {
        __p_01 = (pointer)xkb_x11_state_new_from_device
                                    (pxVar5,(((this->super_QXcbObject).m_connection)->
                                            super_QXcbBasicConnection).m_xcbConnection,
                                     this->core_device_id);
LAB_0015b493:
        std::__uniq_ptr_impl<xkb_state,_QXkbCommon::XKBStateDeleter>::reset
                  ((__uniq_ptr_impl<xkb_state,_QXkbCommon::XKBStateDeleter> *)&this->m_xkbState,
                   __p_01);
      }
    }
    else {
      pxVar5 = keymapFromCore(this,&local_28);
      std::__uniq_ptr_impl<xkb_keymap,_QXkbCommon::XKBKeymapDeleter>::reset
                ((__uniq_ptr_impl<xkb_keymap,_QXkbCommon::XKBKeymapDeleter> *)&this->m_xkbKeymap,
                 pxVar5);
      if ((this->m_xkbKeymap)._M_t.super___uniq_ptr_impl<xkb_keymap,_QXkbCommon::XKBKeymapDeleter>.
          _M_t.super__Tuple_impl<0UL,_xkb_keymap_*,_QXkbCommon::XKBKeymapDeleter>.
          super__Head_base<0UL,_xkb_keymap_*,_false>._M_head_impl != (xkb_keymap *)0x0) {
        __p_01 = (pointer)xkb_state_new();
        goto LAB_0015b493;
      }
    }
    if ((this->m_xkbKeymap)._M_t.super___uniq_ptr_impl<xkb_keymap,_QXkbCommon::XKBKeymapDeleter>.
        _M_t.super__Tuple_impl<0UL,_xkb_keymap_*,_QXkbCommon::XKBKeymapDeleter>.
        super__Head_base<0UL,_xkb_keymap_*,_false>._M_head_impl == (xkb_keymap *)0x0) {
      pQVar4 = QtPrivateLogging::lcQpaKeyboard();
      if (((pQVar4->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_48._24_8_ = pQVar4->name;
        pcVar6 = "failed to compile a keymap";
LAB_0015b555:
        local_48._20_4_ = 0;
        local_48._12_8_ = 0;
        local_48._4_8_ = 0;
        local_48._0_4_ = 2;
        QMessageLogger::warning(local_48,pcVar6);
      }
    }
    else {
      if ((this->m_xkbState)._M_t.super___uniq_ptr_impl<xkb_state,_QXkbCommon::XKBStateDeleter>._M_t
          .super__Tuple_impl<0UL,_xkb_state_*,_QXkbCommon::XKBStateDeleter>.
          super__Head_base<0UL,_xkb_state_*,_false>._M_head_impl != (xkb_state *)0x0) {
        updateXKBMods(this);
        QXkbCommon::verifyHasLatinLayout
                  ((this->m_xkbKeymap)._M_t.
                   super___uniq_ptr_impl<xkb_keymap,_QXkbCommon::XKBKeymapDeleter>._M_t.
                   super__Tuple_impl<0UL,_xkb_keymap_*,_QXkbCommon::XKBKeymapDeleter>.
                   super__Head_base<0UL,_xkb_keymap_*,_false>._M_head_impl);
        goto LAB_0015b560;
      }
      pQVar4 = QtPrivateLogging::lcQpaKeyboard();
      if (((pQVar4->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_48._24_8_ = pQVar4->name;
        pcVar6 = "failed to create XKB state";
        goto LAB_0015b555;
      }
    }
  }
  this->m_config = false;
LAB_0015b560:
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_28.d);
  if (*(xcb_key_symbols_t **)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXcbKeyboard::updateKeymap()
{
    KeysymModifierMap keysymMods;
    if (!connection()->hasXKB())
        keysymMods = keysymsToModifiers();
    updateModifiers(keysymMods);

    m_config = true;

    if (!m_xkbContext) {
        m_xkbContext.reset(xkb_context_new(XKB_CONTEXT_NO_DEFAULT_INCLUDES));
        if (!m_xkbContext) {
            qCWarning(lcQpaKeyboard, "failed to create XKB context");
            m_config = false;
            return;
        }
        xkb_log_level logLevel = lcQpaKeyboard().isDebugEnabled() ?
                                 XKB_LOG_LEVEL_DEBUG : XKB_LOG_LEVEL_CRITICAL;
        xkb_context_set_log_level(m_xkbContext.get(), logLevel);
    }

    if (connection()->hasXKB()) {
        m_xkbKeymap.reset(xkb_x11_keymap_new_from_device(m_xkbContext.get(), xcb_connection(),
                                                         core_device_id, XKB_KEYMAP_COMPILE_NO_FLAGS));
        if (m_xkbKeymap)
            m_xkbState.reset(xkb_x11_state_new_from_device(m_xkbKeymap.get(), xcb_connection(), core_device_id));
    } else {
        m_xkbKeymap.reset(keymapFromCore(keysymMods));
        if (m_xkbKeymap)
            m_xkbState.reset(xkb_state_new(m_xkbKeymap.get()));
    }

    if (!m_xkbKeymap) {
        qCWarning(lcQpaKeyboard, "failed to compile a keymap");
        m_config = false;
        return;
    }
    if (!m_xkbState) {
        qCWarning(lcQpaKeyboard, "failed to create XKB state");
        m_config = false;
        return;
    }

    updateXKBMods();

    QXkbCommon::verifyHasLatinLayout(m_xkbKeymap.get());
}